

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<DataStream,unsigned_char,unsigned_char[78]>
               (DataStream *s,uchar *args,uchar (*args_1) [78])

{
  uchar (*in_RDI) [78];
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffd8;
  DataStream *s_00;
  
  s_00 = *(DataStream **)(in_FS_OFFSET + 0x28);
  Serialize<DataStream>(in_stack_ffffffffffffffd8,'\0');
  Serialize<DataStream,_unsigned_char,_78>(s_00,in_RDI);
  if (*(DataStream **)(in_FS_OFFSET + 0x28) == s_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}